

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O3

size_t __thiscall jessilib::thread_pool::active(thread_pool *this)

{
  pointer ptVar1;
  pointer ptVar2;
  _Elt_pointer pptVar3;
  _Map_pointer ppptVar4;
  _Map_pointer ppptVar5;
  _Elt_pointer pptVar6;
  _Elt_pointer pptVar7;
  _Elt_pointer pptVar8;
  int iVar9;
  
  iVar9 = pthread_mutex_lock((pthread_mutex_t *)&this->m_inactive_threads_mutex);
  if (iVar9 == 0) {
    ptVar1 = (this->m_threads).
             super__Vector_base<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ptVar2 = (this->m_threads).
             super__Vector_base<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pptVar3 = (this->m_inactive_threads).c.
              super__Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppptVar4 = (this->m_inactive_threads).c.
               super__Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppptVar5 = (this->m_inactive_threads).c.
               super__Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    pptVar6 = (this->m_inactive_threads).c.
              super__Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    pptVar7 = (this->m_inactive_threads).c.
              super__Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first;
    pptVar8 = (this->m_inactive_threads).c.
              super__Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_inactive_threads_mutex);
    return (((((ulong)((long)ppptVar4 - (long)ppptVar5) >> 3) - 1) +
            (ulong)(ppptVar4 == (_Map_pointer)0x0)) * -0x40 +
           ((long)ptVar1 - (long)ptVar2 >> 3) * -0xf0f0f0f0f0f0f0f) -
           (((long)pptVar3 - (long)pptVar8 >> 3) + ((long)pptVar6 - (long)pptVar7 >> 3));
  }
  std::__throw_system_error(iVar9);
}

Assistant:

size_t thread_pool::active() const {
	std::lock_guard<std::mutex> guard(m_inactive_threads_mutex);
	return threads() - m_inactive_threads.size();
}